

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumofintegerfromfile.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int *n;
  istream *piVar1;
  pointer piVar2;
  ostream *poVar3;
  int iVar4;
  int local_26c;
  vector<int,_std::allocator<int>_> nums;
  string line;
  ifstream stream;
  
  std::ifstream::ifstream((istream *)&stream,"/home/arkezar/fib",_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    local_26c = std::__cxx11::stoi(&line,(size_t *)0x0,10);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&nums,&local_26c);
  }
  iVar4 = 0;
  for (piVar2 = nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar2 != nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    iVar4 = iVar4 + *piVar2;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&nums.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
//    ifstream stream(argv[1]);
    ifstream stream("/home/arkezar/fib");
    string line;
    vector<int> nums;
    while (getline(stream, line)) {
        nums.push_back(stoi(line));
    }
    int sum = 0;
    for(const auto& n : nums)
        sum += n;
    cout << sum << endl;
    return 0;
}